

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# drbg.c
# Opt level: O2

void add(uint8_t *out,size_t nout,uint8_t *in,size_t nin)

{
  int oi;
  uint uVar1;
  uint uVar2;
  
  if (in < (uint8_t *)0x38) {
    uVar2 = 0;
    for (uVar1 = 0x36; -1 < (int)uVar1; uVar1 = uVar1 - 1) {
      uVar2 = uVar2 + out[uVar1];
      if (0 < (int)((int)in + uVar1 + -0x36)) {
        uVar2 = uVar2 + *(byte *)(nout + (((int)in + uVar1) - 0x37));
      }
      out[uVar1] = (uint8_t)uVar2;
      uVar2 = uVar2 >> 8;
    }
    return;
  }
  abort();
}

Assistant:

static void add(uint8_t *out, size_t nout, const uint8_t *in, size_t nin)
{
  assert(nout >= nin);

  uint16_t carry = 0;
  
  for (int oi = nout - 1, ii = nin - 1;
       oi >= 0;
       ii--, oi--)
  {
    carry += out[oi];
    if (ii >= 0)
      carry += in[ii];
    out[oi] = carry & 0xff;
    carry >>= 8;
  }
}